

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_test.cc
# Opt level: O3

void __thiscall
message_test_should_overwrite_tags_in_message_Test::TestBody
          (message_test_should_overwrite_tags_in_message_Test *this)

{
  bool bVar1;
  Type *lhs;
  Type *lhs_00;
  char *pcVar2;
  undefined1 local_f40 [8];
  AssertionResult gtest_ar;
  undefined1 local_e38 [3280];
  Type local_168;
  bool local_160;
  bitset<2UL> local_158;
  bitset<8UL> bStack_150;
  undefined1 *local_148;
  undefined1 *local_140;
  AssertHelper *local_138;
  undefined1 local_130 [240];
  AssertHelper local_40;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  AssertionResult gtest_ar_1;
  
  local_38.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000008;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_f40,"MyMessageTags","LogonTags + 1",&TestBody::MyMessageTags,
             (unsigned_long *)&local_38);
  if (local_f40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (gtest_ar._0_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/message_test.cc"
               ,0xb8,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_1.message_,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    if (local_38.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_38.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_38.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_f40[0] != (internal)0x0) {
    memset(&gtest_ar.message_,0,0xdd8);
    gtest_ar.success_ = false;
    gtest_ar._1_7_ = 0;
    local_f40 = (undefined1  [8])&gtest_ar.message_;
    memset(local_e38,0,0xcd0);
    local_160 = true;
    local_158.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)0;
    bStack_150.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)0;
    local_138 = &local_40;
    local_148 = local_130;
    local_140 = local_130;
    Fixpp::
    set<Fixpp::TagT<108u,Fixpp::Type::String>,Fixpp::VersionnedMessage<Fixpp::v42::Version,Fixpp::Chars<(char)65>,Fixpp::Required<Fixpp::TagT<98u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<108u,Fixpp::Type::String>>,Fixpp::TagT<95u,Fixpp::Type::String>,Fixpp::TagT<96u,Fixpp::Type::String>,Fixpp::TagT<141u,Fixpp::Type::String>,Fixpp::TagT<383u,Fixpp::Type::String>,Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>,Fixpp::TagT<2154u,Fixpp::Type::Int>>,char_const(&)[4]>
              ((VersionnedMessage<Fixpp::v42::Version,_Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::String>_>,_Fixpp::TagT<95U,_Fixpp::Type::String>,_Fixpp::TagT<96U,_Fixpp::Type::String>,_Fixpp::TagT<141U,_Fixpp::Type::String>,_Fixpp::TagT<383U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>,_Fixpp::TagT<2154U,_Fixpp::Type::Int>_>
                *)local_f40,(char (*) [4])"30s");
    lhs = Fixpp::
          get<Fixpp::TagT<108u,Fixpp::Type::String>,Fixpp::VersionnedMessage<Fixpp::v42::Version,Fixpp::Chars<(char)65>,Fixpp::Required<Fixpp::TagT<98u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<108u,Fixpp::Type::String>>,Fixpp::TagT<95u,Fixpp::Type::String>,Fixpp::TagT<96u,Fixpp::Type::String>,Fixpp::TagT<141u,Fixpp::Type::String>,Fixpp::TagT<383u,Fixpp::Type::String>,Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>,Fixpp::TagT<2154u,Fixpp::Type::Int>>>
                    ((VersionnedMessage<Fixpp::v42::Version,_Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::String>_>,_Fixpp::TagT<95U,_Fixpp::Type::String>,_Fixpp::TagT<96U,_Fixpp::Type::String>,_Fixpp::TagT<141U,_Fixpp::Type::String>,_Fixpp::TagT<383U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>,_Fixpp::TagT<2154U,_Fixpp::Type::Int>_>
                      *)local_f40);
    testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
              ((internal *)&local_38,"Fixpp::get<HeartBtStr>(message)","\"30s\"",lhs,
               (char (*) [4])"30s");
    if (local_38.ptr_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&gtest_ar_1.message_);
      if (gtest_ar_1._0_8_ == 0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)gtest_ar_1._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_40,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/message_test.cc"
                 ,0xbd,pcVar2);
      testing::internal::AssertHelper::operator=(&local_40,(Message *)&gtest_ar_1.message_);
      testing::internal::AssertHelper::~AssertHelper(&local_40);
      if (CONCAT44(gtest_ar_1.message_.ptr_._4_4_,gtest_ar_1.message_.ptr_._0_4_) != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           ((long *)CONCAT44(gtest_ar_1.message_.ptr_._4_4_,gtest_ar_1.message_.ptr_._0_4_) !=
            (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(gtest_ar_1.message_.ptr_._4_4_,
                                         gtest_ar_1.message_.ptr_._0_4_) + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      ;
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      ;
      local_168 = 0x4bc;
      local_160 = false;
      bStack_150.super__Base_bitset<1UL>._M_w =
           (_Base_bitset<1UL>)((ulong)bStack_150.super__Base_bitset<1UL>._M_w | 0x80);
      lhs_00 = Fixpp::
               get<Fixpp::TagT<2154u,Fixpp::Type::Int>,Fixpp::VersionnedMessage<Fixpp::v42::Version,Fixpp::Chars<(char)65>,Fixpp::Required<Fixpp::TagT<98u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<108u,Fixpp::Type::String>>,Fixpp::TagT<95u,Fixpp::Type::String>,Fixpp::TagT<96u,Fixpp::Type::String>,Fixpp::TagT<141u,Fixpp::Type::String>,Fixpp::TagT<383u,Fixpp::Type::String>,Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>,Fixpp::TagT<2154u,Fixpp::Type::Int>>>
                         ((VersionnedMessage<Fixpp::v42::Version,_Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::String>_>,_Fixpp::TagT<95U,_Fixpp::Type::String>,_Fixpp::TagT<96U,_Fixpp::Type::String>,_Fixpp::TagT<141U,_Fixpp::Type::String>,_Fixpp::TagT<383U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>,_Fixpp::TagT<2154U,_Fixpp::Type::Int>_>
                           *)local_f40);
      gtest_ar_1.message_.ptr_._0_4_ = 0x4bc;
      testing::internal::CmpHelperEQ<long,int>
                ((internal *)&local_38,"Fixpp::get<MyTag>(message)","1212",lhs_00,
                 (int *)&gtest_ar_1.message_);
      if (local_38.ptr_._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&gtest_ar_1.message_);
        if (gtest_ar_1._0_8_ == 0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)gtest_ar_1._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_40,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/message_test.cc"
                   ,0xc0,pcVar2);
        testing::internal::AssertHelper::operator=(&local_40,(Message *)&gtest_ar_1.message_);
        testing::internal::AssertHelper::~AssertHelper(&local_40);
        if (CONCAT44(gtest_ar_1.message_.ptr_._4_4_,gtest_ar_1.message_.ptr_._0_4_) != 0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             ((long *)CONCAT44(gtest_ar_1.message_.ptr_._4_4_,gtest_ar_1.message_.ptr_._0_4_) !=
              (long *)0x0)) {
            (**(code **)(*(long *)CONCAT44(gtest_ar_1.message_.ptr_._4_4_,
                                           gtest_ar_1.message_.ptr_._0_4_) + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      ;
    }
    if (local_148 != local_130) {
      free(local_148);
    }
    meta::impl::
    tuple_base<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL,_6UL,_7UL>,_Fixpp::Field<Fixpp::TagT<98U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<108U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<95U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<96U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<141U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<383U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_Fixpp::Field<Fixpp::TagT<2154U,_Fixpp::Type::Int>_>_>
    ::~tuple_base((tuple_base<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL,_6UL,_7UL>,_Fixpp::Field<Fixpp::TagT<98U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<108U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<95U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<96U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<141U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<383U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_Fixpp::Field<Fixpp::TagT<2154U,_Fixpp::Type::Int>_>_>
                   *)local_f40);
  }
  return;
}

Assistant:

TEST(message_test, should_overwrite_tags_in_message)
{
    using namespace Fixpp;
    using MyTag = Fixpp::TagT<2154, Fixpp::Type::Int>;

    struct LogonOverwrite : public Fixpp::MessageOverwrite<Fixpp::v42::Message::Logon>
    {
        using OverwriteHeartBtInt = ChangeType<Of<Tag::HeartBtInt>, To<Type::String>>;
        using HeartBtStr = typename OverwriteHeartBtInt::Type;

        using Changes = ChangeSet<
           OverwriteHeartBtInt,
           AddTag<MyTag>
      >;
    };

    using MyMessage = LogonOverwrite::Changes::Apply;
    using HeartBtStr = LogonOverwrite::HeartBtStr;

    static constexpr size_t LogonTags = Fixpp::v42::Message::Logon::TotalTags;
    static constexpr size_t MyMessageTags = MyMessage::TotalTags;

    // MyMessage should have one more tag
    ASSERT_EQ(MyMessageTags, LogonTags + 1);

    MyMessage message;

    Fixpp::set<HeartBtStr>(message, "30s");
    ASSERT_EQ(Fixpp::get<HeartBtStr>(message), "30s");

    Fixpp::set<MyTag>(message, 1212);
    ASSERT_EQ(Fixpp::get<MyTag>(message), 1212);
}